

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader.c
# Opt level: O1

char * ext_loader_print_info(void)

{
  return 
  "Extension Loader Plugin 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *ext_loader_print_info(void)
{
	static const char ext_loader_info[] =
		"Extension Loader Plugin " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef FILE_LOADER_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return ext_loader_info;
}